

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

void __thiscall
Rml::DataViewCommon::DataViewCommon
          (DataViewCommon *this,Element *element,String *override_modifier,int sort_offset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  DataView::DataView(&this->super_DataView,element,sort_offset);
  (this->super_DataView).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewCommon_0032e650;
  paVar1 = &(this->modifier).field_2;
  (this->modifier)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (override_modifier->_M_dataplus)._M_p;
  paVar2 = &override_modifier->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&override_modifier->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->modifier).field_2 + 8) = uVar4;
  }
  else {
    (this->modifier)._M_dataplus._M_p = pcVar3;
    (this->modifier).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->modifier)._M_string_length = override_modifier->_M_string_length;
  (override_modifier->_M_dataplus)._M_p = (pointer)paVar2;
  override_modifier->_M_string_length = 0;
  (override_modifier->field_2)._M_local_buf[0] = '\0';
  (this->expression)._M_t.
  super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>._M_t.
  super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>.
  super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl = (DataExpression *)0x0;
  return;
}

Assistant:

DataViewCommon::DataViewCommon(Element* element, String override_modifier, int sort_offset) :
	DataView(element, sort_offset), modifier(std::move(override_modifier))
{}